

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::InstallSegueBase(CWriter *this,Memory *memory,bool save_old_value)

{
  anon_class_8_1_8991fb9c local_e0;
  function<void_()> local_d8;
  Newline local_b1;
  undefined1 local_b0 [8];
  ExternalInstanceRef primary_memory;
  function<void_()> local_98;
  Newline local_71;
  anon_class_8_1_8991fb9c local_70;
  function<void_()> local_68;
  anon_class_8_1_8991fb9c local_48;
  function<void_()> local_40;
  byte local_19;
  Memory *pMStack_18;
  bool save_old_value_local;
  Memory *memory_local;
  CWriter *this_local;
  
  local_48.this = this;
  local_19 = save_old_value;
  pMStack_18 = memory;
  memory_local = (Memory *)this;
  std::function<void()>::
  function<wabt::(anonymous_namespace)::CWriter::InstallSegueBase(wabt::Memory*,bool)::__0,void>
            ((function<void()> *)&local_40,&local_48);
  NonIndented(this,&local_40);
  std::function<void_()>::~function(&local_40);
  if ((local_19 & 1) != 0) {
    local_70.this = this;
    std::function<void()>::
    function<wabt::(anonymous_namespace)::CWriter::InstallSegueBase(wabt::Memory*,bool)::__1,void>
              ((function<void()> *)&local_68,&local_70);
    NonIndented(this,&local_68);
    std::function<void_()>::~function(&local_68);
    (anonymous_namespace)::CWriter::Write<char_const(&)[52],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [52])"void* segue_saved_base = wasm_rt_segue_read_base();",
               &local_71);
    primary_memory.super_GlobalName.name = (string *)this;
    std::function<void()>::
    function<wabt::(anonymous_namespace)::CWriter::InstallSegueBase(wabt::Memory*,bool)::__2,void>
              ((function<void()> *)&local_98,
               (anon_class_8_1_8991fb9c *)&primary_memory.super_GlobalName.name);
    NonIndented(this,&local_98);
    std::function<void_()>::~function(&local_98);
  }
  ExternalInstanceRef::GlobalName((ExternalInstanceRef *)local_b0,Memory,&pMStack_18->name);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[26],wabt::(anonymous_namespace)::ExternalInstanceRef&,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [26])"wasm_rt_segue_write_base(",
             (ExternalInstanceRef *)local_b0,(char (*) [8])".data);",&local_b1);
  local_e0.this = this;
  std::function<void()>::
  function<wabt::(anonymous_namespace)::CWriter::InstallSegueBase(wabt::Memory*,bool)::__3,void>
            ((function<void()> *)&local_d8,&local_e0);
  NonIndented(this,&local_d8);
  std::function<void_()>::~function(&local_d8);
  return;
}

Assistant:

void CWriter::InstallSegueBase(Memory* memory, bool save_old_value) {
  NonIndented(
      [&] { Write("#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE", Newline()); });
  if (save_old_value) {
    NonIndented([&] { Write("#if !WASM_RT_SEGUE_FREE_SEGMENT", Newline()); });
    Write("void* segue_saved_base = wasm_rt_segue_read_base();", Newline());
    NonIndented([&] { Write("#endif", Newline()); });
  }
  auto primary_memory =
      ExternalInstanceRef(ModuleFieldType::Memory, memory->name);
  Write("wasm_rt_segue_write_base(", primary_memory, ".data);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}